

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O2

void __thiscall lsim::ModelCircuit::disconnect_pin(ModelCircuit *this,pin_id_t pin)

{
  _Hash_node_base *p_Var1;
  pointer puVar2;
  __node_base *p_Var3;
  uint32_t *puVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> empty_wires;
  uint local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (uint32_t *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (uint32_t *)0x0;
  p_Var3 = &(this->m_wires)._M_h._M_before_begin;
  while (puVar2 = local_48._M_impl.super__Vector_impl_data._M_finish, p_Var3 = p_Var3->_M_nxt,
        puVar4 = local_48._M_impl.super__Vector_impl_data._M_start, p_Var3 != (__node_base *)0x0) {
    ModelWire::remove_pin
              (*(ModelWire **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor,pin);
    p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
    if (p_Var1[2]._M_nxt == p_Var1[1]._M_nxt) {
      local_4c = *(uint *)&p_Var1->_M_nxt;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
    }
  }
  for (; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    remove_wire(this,*puVar4);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void ModelCircuit::disconnect_pin(pin_id_t pin) {
    std::vector<uint32_t> empty_wires;

    for (auto &pair : m_wires) {
        pair.second->remove_pin(pin);
        if (pair.second->num_pins() == 0) {
            empty_wires.push_back(pair.second->id());
        }
    }

    for (const auto id : empty_wires) {
        remove_wire(id);
    }
}